

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O3

void __thiscall nuraft::inmem_log_store::~inmem_log_store(inmem_log_store *this)

{
  thread *ptVar1;
  
  (this->super_log_store)._vptr_log_store = (_func_int **)&PTR__inmem_log_store_0061b0d0;
  if ((this->disk_emul_thread_)._M_t.
      super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
      super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    LOCK();
    (this->disk_emul_thread_stop_signal_)._M_base._M_i = true;
    UNLOCK();
    EventAwaiter::invoke(&this->disk_emul_ea_);
    if ((((this->disk_emul_thread_)._M_t.
          super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl)->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::condition_variable::~condition_variable(&(this->disk_emul_ea_).cv);
  ptVar1 = (this->disk_emul_thread_)._M_t.
           super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl;
  if (ptVar1 != (thread *)0x0) {
    if ((ptVar1->_M_id)._M_thread != 0) {
      std::terminate();
    }
    operator_delete(ptVar1);
  }
  (this->disk_emul_thread_)._M_t.
  super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~_Rb_tree(&(this->disk_emul_logs_being_written_)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  ::~_Rb_tree(&(this->logs_)._M_t);
  return;
}

Assistant:

inmem_log_store::~inmem_log_store() {
    if (disk_emul_thread_) {
        disk_emul_thread_stop_signal_ = true;
        disk_emul_ea_.invoke();
        if (disk_emul_thread_->joinable()) {
            disk_emul_thread_->join();
        }
    }
}